

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode
JsSetModuleHostInfo(JsModuleRecord requestModule,JsModuleHostInfoKind moduleHostInfo,void *hostInfo)

{
  ScriptContext *scriptContext;
  bool bVar1;
  HRESULT HVar2;
  JsrtContext *pJVar3;
  JsrtContext *context;
  Type *pTVar4;
  JsErrorCode JVar5;
  SourceTextModuleRecord *unaff_R12;
  Type *addr;
  void *unaff_retaddr;
  undefined1 local_a0 [8];
  EnterScriptObject __enterScriptObject;
  TTDebuggerAbortException anon_var_0;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if ((requestModule == (JsModuleRecord)0x0) || (*(int *)((long)requestModule + 8) != 0x65646f4d)) {
    if ((moduleHostInfo < JsModuleHostInfo_InitializeImportMetaCallback) &&
       ((0x46U >> (moduleHostInfo & 0x1f) & 1) != 0)) {
      return JsErrorInvalidArgument;
    }
    pJVar3 = JsrtContext::GetCurrent();
    pTVar4 = &(((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext;
  }
  else {
    unaff_R12 = Js::SourceTextModuleRecord::FromHost(requestModule);
    pTVar4 = &unaff_R12->scriptContext;
  }
  pJVar3 = (JsrtContext *)
           Js::JavascriptLibrary::GetJsrtContext
                     ((pTVar4->ptr->super_ScriptContextBase).javascriptLibrary);
  context = JsrtContext::GetCurrent();
  scriptContext = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                      ExceptionType_OutOfMemory);
  bVar1 = JsrtContext::TrySetCurrent(pJVar3);
  JVar5 = JsErrorWrongThread;
  if (!bVar1) goto LAB_003bd9b8;
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_a0,scriptContext,
             (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
             true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_a0);
  pJVar3 = JsrtContext::GetCurrent();
  switch(moduleHostInfo) {
  case JsModuleHostInfo_Exception:
    HVar2 = Js::SourceTextModuleRecord::OnHostException(unaff_R12,hostInfo);
    JVar5 = JsErrorInvalidArgument;
    if (HVar2 == 0) {
      JVar5 = JsNoError;
    }
    goto LAB_003bd9ac;
  case JsModuleHostInfo_HostDefined:
    addr = &unaff_R12->hostDefined;
    Memory::Recycler::WBSetBit((char *)addr);
    goto LAB_003bd992;
  case JsModuleHostInfo_NotifyModuleReadyCallback:
    pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[4] =
         (_func_int *)hostInfo;
    break;
  case JsModuleHostInfo_FetchImportedModuleCallback:
    pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[2] =
         (_func_int *)hostInfo;
    break;
  case JsModuleHostInfo_FetchImportedModuleFromScriptCallback:
    pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[3] =
         (_func_int *)hostInfo;
    break;
  case JsModuleHostInfo_Url:
    addr = &unaff_R12->normalizedSpecifier;
    Memory::Recycler::WBSetBit((char *)addr);
LAB_003bd992:
    addr->ptr = hostInfo;
    JVar5 = JsNoError;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    goto LAB_003bd9ac;
  case JsModuleHostInfo_InitializeImportMetaCallback:
    pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[5] =
         (_func_int *)hostInfo;
    break;
  case JsModuleHostInfo_ReportModuleCompletionCallback:
    pJVar3[1].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[6] =
         (_func_int *)hostInfo;
    break;
  default:
    JVar5 = JsInvalidModuleHostInfoKind;
    goto LAB_003bd9ac;
  }
  JVar5 = JsNoError;
LAB_003bd9ac:
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_a0);
LAB_003bd9b8:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&__enterScriptObject.library,
             ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  JsrtContext::TrySetCurrent(context);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&__enterScriptObject.library);
  return JVar5;
}

Assistant:

CHAKRA_API
JsSetModuleHostInfo(
    _In_opt_ JsModuleRecord requestModule,
    _In_ JsModuleHostInfoKind moduleHostInfo,
    _In_ void* hostInfo)
{
    Js::ScriptContext* scriptContext;
    Js::SourceTextModuleRecord* moduleRecord;
    if (!Js::SourceTextModuleRecord::Is(requestModule))
    {
        if (moduleHostInfo == JsModuleHostInfo_Exception ||
            moduleHostInfo == JsModuleHostInfo_HostDefined ||
            moduleHostInfo == JsModuleHostInfo_Url)
        {
            return JsErrorInvalidArgument;
        }
        scriptContext = JsrtContext::GetCurrent()->GetScriptContext();
    }
    else
    {
        moduleRecord = Js::SourceTextModuleRecord::FromHost(requestModule);
        scriptContext = moduleRecord->GetScriptContext();
    }
    JsrtContext* jsrtContext = (JsrtContext*)scriptContext->GetLibrary()->GetJsrtContext();
    JsErrorCode errorCode = SetContextAPIWrapper(jsrtContext, [&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        JsrtContextCore* currentContext = static_cast<JsrtContextCore*>(JsrtContextCore::GetCurrent());
        switch (moduleHostInfo)
        {
        case JsModuleHostInfo_Exception:
            {
            HRESULT hr = moduleRecord->OnHostException(hostInfo);
            return (hr == NOERROR) ? JsNoError : JsErrorInvalidArgument;
            }
        case JsModuleHostInfo_HostDefined:
            moduleRecord->SetHostDefined(hostInfo);
            break;
        case JsModuleHostInfo_FetchImportedModuleCallback:
            currentContext->GetHostScriptContext()->SetFetchImportedModuleCallback(reinterpret_cast<FetchImportedModuleCallBack>(hostInfo));
            break;
        case JsModuleHostInfo_FetchImportedModuleFromScriptCallback:
            currentContext->GetHostScriptContext()->SetFetchImportedModuleFromScriptCallback(reinterpret_cast<FetchImportedModuleFromScriptCallBack>(hostInfo));
            break;
        case JsModuleHostInfo_NotifyModuleReadyCallback:
            currentContext->GetHostScriptContext()->SetNotifyModuleReadyCallback(reinterpret_cast<NotifyModuleReadyCallback>(hostInfo));
            break;
        case JsModuleHostInfo_InitializeImportMetaCallback:
            currentContext->GetHostScriptContext()->SetInitializeImportMetaCallback(reinterpret_cast<InitializeImportMetaCallback>(hostInfo));
            break;
        case JsModuleHostInfo_ReportModuleCompletionCallback:
            currentContext->GetHostScriptContext()->SetReportModuleCompletionCallback(reinterpret_cast<ReportModuleCompletionCallback>(hostInfo));
            break;
        case JsModuleHostInfo_Url:
            moduleRecord->SetSpecifier(hostInfo);
            break;
        default:
            return JsInvalidModuleHostInfoKind;
        };
        return JsNoError;
    });
    return errorCode;
}